

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusxml2cpp.cpp
# Opt level: O2

QByteArray * __thiscall
QDBusXmlToCpp::qtTypeName
          (QByteArray *__return_storage_ptr__,QDBusXmlToCpp *this,SourceLocation *location,
          QString *signature,Annotations *annotations,qsizetype paramId,char *direction)

{
  int iVar1;
  DiagnosticsReporter *this_00;
  char *pcVar2;
  long in_FS_OFFSET;
  QAnyStringView QVar3;
  QAnyStringView QVar4;
  QLatin1String local_168;
  QArrayDataPointer<char16_t> local_158;
  QArrayDataPointer<char16_t> local_140;
  Annotation local_128;
  Annotation annotation;
  QArrayDataPointer<char16_t> local_a8;
  Annotation local_88;
  Annotation *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QString::toLatin1_helper((QString *)&annotation);
  pcVar2 = (char *)annotation.location.columnNumber;
  if (annotation.location.columnNumber == 0) {
    pcVar2 = (char *)&QByteArray::_empty;
  }
  local_128.location.lineNumber = QDBusMetaType::signatureToMetaType(pcVar2);
  iVar1 = QMetaType::registerHelper((QMetaType *)&local_128);
  QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&annotation);
  if (iVar1 == 0) {
    local_a8.size = -0x5555555555555556;
    local_a8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_a8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    Qt::Literals::StringLiterals::operator____s
              ((QString *)&local_a8,L"org.qtproject.QtDBus.QtTypeName",0x1f);
    if (-1 < paramId) {
      QLatin1String::QLatin1String((QLatin1String *)&local_140,direction);
      annotation.name.d.d = (Data *)((ulong)local_140.d | 0x4000000000000000);
      annotation.location.lineNumber = CONCAT71(annotation.location.lineNumber._1_7_,1);
      annotation.location.columnNumber = (qint64)local_140.ptr;
      local_88.location.columnNumber = 0;
      QVar3.m_size = (size_t)".%1%2";
      QVar3.field_0.m_data = &local_128;
      local_88.location.lineNumber = (qint64)&annotation;
      QtPrivate::argToQString(QVar3,0x4000000000000005,(ArgBase **)0x1);
      QString::arg_impl((longlong)&annotation,(int)&local_128,(int)paramId,(QChar)0x0);
      QString::append((QString *)&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&annotation);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
    }
    annotation.value.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    annotation.value.d.size = -0x5555555555555556;
    annotation.name.d.size = -0x5555555555555556;
    annotation.value.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    annotation.name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
    annotation.name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    annotation.location.lineNumber = -0x5555555555555556;
    annotation.location.columnNumber = -0x5555555555555556;
    local_128.location.lineNumber = 1;
    local_128.location.columnNumber = 0;
    local_128.name.d.d = (Data *)0x0;
    local_128.name.d.ptr = (char16_t *)0x0;
    local_128.name.d.size = 0;
    local_128.value.d.d = (Data *)0x0;
    local_128.value.d.ptr = (char16_t *)0x0;
    local_128.value.d.size = 0;
    QMap<QString,_QDBusIntrospection::Annotation>::value
              (&annotation,annotations,(QString *)&local_a8,&local_128);
    QDBusIntrospection::Annotation::~Annotation(&local_128);
    local_140.d = annotation.value.d.d;
    local_140.ptr = annotation.value.d.ptr;
    local_140.size = annotation.value.d.size;
    if (annotation.value.d.d != (Data *)0x0) {
      LOCK();
      ((annotation.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((annotation.value.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           1;
      UNLOCK();
    }
    if (annotation.value.d.size == 0) {
      local_158.size = -0x5555555555555556;
      local_158.d = (Data *)0xaaaaaaaaaaaaaaaa;
      local_158.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
      Qt::Literals::StringLiterals::operator____s
                ((QString *)&local_158,L"com.trolltech.QtDBus.QtTypeName",0x1f);
      if (-1 < paramId) {
        QLatin1String::QLatin1String(&local_168,direction);
        local_128.name.d.d = (Data *)(local_168.m_size | 0x4000000000000000);
        local_128.location.lineNumber = CONCAT71(local_128.location.lineNumber._1_7_,1);
        local_128.location.columnNumber = (qint64)local_168.m_data;
        local_40 = 0;
        QVar4.m_size = (size_t)".%1%2";
        QVar4.field_0.m_data = &local_88;
        local_48 = &local_128;
        QtPrivate::argToQString(QVar4,0x4000000000000005,(ArgBase **)0x1);
        QString::arg_impl((longlong)&local_128,(int)&local_88,(int)paramId,(QChar)0x0);
        QString::append((QString *)&local_158);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_128);
        QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_88);
      }
      local_88.location.lineNumber = 1;
      local_88.location.columnNumber = 0;
      local_88.name.d.d = (Data *)0x0;
      local_88.name.d.ptr = (char16_t *)0x0;
      local_88.name.d.size = 0;
      local_88.value.d.d = (Data *)0x0;
      local_88.value.d.ptr = (char16_t *)0x0;
      local_88.value.d.size = 0;
      QMap<QString,_QDBusIntrospection::Annotation>::value
                (&local_128,annotations,(QString *)&local_158,&local_88);
      QDBusIntrospection::Annotation::operator=(&annotation,&local_128);
      QDBusIntrospection::Annotation::~Annotation(&local_128);
      QDBusIntrospection::Annotation::~Annotation(&local_88);
      QString::operator=((QString *)&local_140,(QString *)&annotation.value);
      this_00 = &this->reporter;
      if (local_140.size == 0) {
        QString::toLocal8Bit((QByteArray *)&local_128,signature);
        pcVar2 = (char *)local_128.location.columnNumber;
        if ((char *)local_128.location.columnNumber == (char *)0x0) {
          pcVar2 = (char *)&QByteArray::_empty;
        }
        DiagnosticsReporter::error(this_00,location,"unknown type `%s\'\n",pcVar2);
        QByteArray::~QByteArray((QByteArray *)&local_128);
        QString::toLocal8Bit((QByteArray *)&local_128,(QString *)&local_a8);
        pcVar2 = (char *)local_128.location.columnNumber;
        if ((char *)local_128.location.columnNumber == (char *)0x0) {
          pcVar2 = (char *)&QByteArray::_empty;
        }
        DiagnosticsReporter::note
                  (this_00,location,"you should add <annotation name=\"%s\" value=\"<type>\"/>\n",
                   pcVar2);
        QByteArray::~QByteArray((QByteArray *)&local_128);
        exit(1);
      }
      QString::toLocal8Bit((QByteArray *)&local_128,(QString *)&local_158);
      pcVar2 = (char *)local_128.location.columnNumber;
      if ((char *)local_128.location.columnNumber == (char *)0x0) {
        pcVar2 = (char *)&QByteArray::_empty;
      }
      DiagnosticsReporter::warning
                (this_00,&annotation.location,"deprecated annotation \'%s\' found\n",pcVar2);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_128);
      QString::toLocal8Bit((QByteArray *)&local_128,(QString *)&local_a8);
      pcVar2 = (char *)local_128.location.columnNumber;
      if ((char *)local_128.location.columnNumber == (char *)0x0) {
        pcVar2 = (char *)&QByteArray::_empty;
      }
      DiagnosticsReporter::note(this_00,&annotation.location,"suggest updating to \'%s\'\n",pcVar2);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_128);
      QString::toLatin1_helper_inplace((QString *)__return_storage_ptr__);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_158);
    }
    else {
      QString::toLatin1_helper_inplace((QString *)__return_storage_ptr__);
    }
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_140);
    QDBusIntrospection::Annotation::~Annotation(&annotation);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
  }
  else {
    QMetaType::QMetaType((QMetaType *)&annotation,iVar1);
    if (annotation.location.lineNumber == 0) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = *(char **)(annotation.location.lineNumber + 0x18);
    }
    QByteArray::QByteArray(__return_storage_ptr__,pcVar2,-1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QDBusXmlToCpp::qtTypeName(const QDBusIntrospection::SourceLocation &location,
                                     const QString &signature,
                                     const QDBusIntrospection::Annotations &annotations,
                                     qsizetype paramId, const char *direction)
{
    int type = QDBusMetaType::signatureToMetaType(signature.toLatin1()).id();
    if (type == QMetaType::UnknownType) {
        QString annotationName = u"org.qtproject.QtDBus.QtTypeName"_s;
        if (paramId >= 0)
            annotationName += ".%1%2"_L1.arg(QLatin1StringView(direction)).arg(paramId);
        auto annotation = annotations.value(annotationName);
        QString qttype = annotation.value;
        if (!qttype.isEmpty())
            return std::move(qttype).toLatin1();

        QString oldAnnotationName = u"com.trolltech.QtDBus.QtTypeName"_s;
        if (paramId >= 0)
            oldAnnotationName += ".%1%2"_L1.arg(QLatin1StringView(direction)).arg(paramId);
        annotation = annotations.value(oldAnnotationName);
        qttype = annotation.value;

        if (qttype.isEmpty()) {
            reporter.error(location, "unknown type `%s'\n", qPrintable(signature));
            reporter.note(location, "you should add <annotation name=\"%s\" value=\"<type>\"/>\n",
                          qPrintable(annotationName));

            exit(1);
        }

        reporter.warning(annotation.location, "deprecated annotation '%s' found\n",
                         qPrintable(oldAnnotationName));
        reporter.note(annotation.location, "suggest updating to '%s'\n",
                      qPrintable(annotationName));
        return std::move(qttype).toLatin1();
    }

    return QMetaType(type).name();
}